

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O2

string * efsw::Platform::findMountPoint(string *__return_storage_ptr__,string *file)

{
  bool bVar1;
  int iVar2;
  string mp;
  string cwd;
  string dir;
  stat last_stat;
  stat file_stat;
  allocator local_269;
  string *local_268;
  pointer local_260;
  size_type local_258;
  char local_250;
  undefined7 uStack_24f;
  undefined8 uStack_248;
  string local_240;
  string local_220;
  string local_200;
  stat local_1e0;
  stat local_150;
  stat local_c0;
  
  FileSystem::getCurrentWorkingDirectory_abi_cxx11_();
  stat((file->_M_dataplus)._M_p,&local_c0);
  local_260 = &local_250;
  local_258 = 0;
  local_250 = '\0';
  bVar1 = efsw::FileSystem::isDirectory(file);
  if (bVar1) {
    memcpy(&local_150,&local_c0,0x90);
    bVar1 = FileSystem::changeWorkingDirectory(file);
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_1e0);
      goto LAB_00109a33;
    }
LAB_001098df:
    local_268 = __return_storage_ptr__;
    while (iVar2 = stat("..",&local_1e0), __return_storage_ptr__ = local_268, -1 < iVar2) {
      if ((local_1e0.st_dev != local_150.st_dev) || (local_1e0.st_ino == local_150.st_ino)) {
        FileSystem::getCurrentWorkingDirectory_abi_cxx11_();
        __return_storage_ptr__ = local_268;
        std::__cxx11::string::operator=((string *)&local_260,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        break;
      }
      std::__cxx11::string::string((string *)&local_200,"..",&local_269);
      bVar1 = FileSystem::changeWorkingDirectory(&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      __return_storage_ptr__ = local_268;
      if (!bVar1) break;
      memcpy(&local_150,&local_1e0,0x90);
    }
    FileSystem::changeWorkingDirectory(&local_220);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_260 == &local_250) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_24f,local_250);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_248;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_260;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_24f,local_250);
    }
    __return_storage_ptr__->_M_string_length = local_258;
    local_258 = 0;
    local_250 = '\0';
    local_260 = &local_250;
  }
  else {
    std::__cxx11::string::string((string *)&local_240,(string *)file);
    efsw::FileSystem::pathRemoveFileName((string *)&local_1e0,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    bVar1 = FileSystem::changeWorkingDirectory((string *)&local_1e0);
    if (bVar1) {
      iVar2 = stat(".",&local_150);
      if (-1 < iVar2) {
        std::__cxx11::string::~string((string *)&local_1e0);
        goto LAB_001098df;
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_200);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_200);
    }
    std::__cxx11::string::~string((string *)&local_1e0);
  }
LAB_00109a33:
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string findMountPoint( std::string file ) {
	std::string cwd = FileSystem::getCurrentWorkingDirectory();
	struct stat last_stat;
	struct stat file_stat;

	stat( file.c_str(), &file_stat );

	std::string mp;

	if ( efsw::FileSystem::isDirectory( file ) ) {
		last_stat = file_stat;

		if ( !FileSystem::changeWorkingDirectory( file ) )
			return "";
	} else {
		std::string dir = efsw::FileSystem::pathRemoveFileName( file );

		if ( !FileSystem::changeWorkingDirectory( dir ) )
			return "";

		if ( stat( ".", &last_stat ) < 0 )
			return "";
	}

	while ( true ) {
		struct stat st;

		if ( stat( "..", &st ) < 0 )
			goto done;

		if ( st.st_dev != last_stat.st_dev || st.st_ino == last_stat.st_ino )
			break;

		if ( !FileSystem::changeWorkingDirectory( ".." ) ) {
			goto done;
		}

		last_stat = st;
	}

	/* Finally reached a mount point, see what it's called.  */
	mp = FileSystem::getCurrentWorkingDirectory();

done:
	FileSystem::changeWorkingDirectory( cwd );

	return mp;
}